

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_key.cpp
# Opt level: O3

PrivkeyHexDataStruct *
cfd::js::api::KeyStructApi::GetPrivkeyFromWif
          (PrivkeyHexDataStruct *__return_storage_ptr__,PrivkeyWifDataStruct *request)

{
  _Rb_tree_header *p_Var1;
  string *in_R8;
  undefined1 local_178 [16];
  undefined1 local_168 [24];
  _Alloc_hider local_150;
  _Base_ptr local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  undefined1 local_130 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  char local_110 [16];
  _Base_ptr local_100 [2];
  undefined1 local_f0 [24];
  _Rb_tree_color local_d8;
  _Base_ptr local_d0 [2];
  undefined1 local_c0 [16];
  _Base_ptr local_b0;
  undefined1 local_a0 [24];
  _Rb_tree_node_base local_88;
  size_t local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_60;
  
  (__return_storage_ptr__->hex)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->hex).field_2;
  (__return_storage_ptr__->hex)._M_string_length = 0;
  (__return_storage_ptr__->hex).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->network)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->network).field_2;
  (__return_storage_ptr__->network)._M_string_length = 0;
  (__return_storage_ptr__->network).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->is_compressed = true;
  (__return_storage_ptr__->error).code = 0;
  (__return_storage_ptr__->error).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).type.field_2;
  (__return_storage_ptr__->error).type._M_string_length = 0;
  (__return_storage_ptr__->error).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).message.field_2;
  (__return_storage_ptr__->error).message._M_string_length = 0;
  (__return_storage_ptr__->error).message.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       local_148;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_148;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178._0_8_ = (pointer)0x0;
  local_178._8_8_ = 0;
  local_168._8_8_ =
       std::
       _Function_handler<cfd::js::api::PrivkeyHexDataStruct_(const_cfd::js::api::PrivkeyWifDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_key.cpp:99:7)>
       ::_M_invoke;
  local_168._0_8_ =
       std::
       _Function_handler<cfd::js::api::PrivkeyHexDataStruct_(const_cfd::js::api::PrivkeyWifDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_key.cpp:99:7)>
       ::_M_manager;
  local_140._M_allocated_capacity = (size_type)local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"GetPrivkeyFromWif","");
  local_150._M_p = (pointer)p_Var1;
  ExecuteStructApi<cfd::js::api::PrivkeyWifDataStruct,cfd::js::api::PrivkeyHexDataStruct>
            ((PrivkeyHexDataStruct *)&local_120,(api *)request,(PrivkeyWifDataStruct *)local_178,
             (function<cfd::js::api::PrivkeyHexDataStruct_(const_cfd::js::api::PrivkeyWifDataStruct_&)>
              *)&local_140,in_R8);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_120._M_local_buf)
  ;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->network,(string *)local_100);
  __return_storage_ptr__->is_compressed = (bool)local_f0[0x10];
  (__return_storage_ptr__->error).code = local_d8;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).type,(string *)local_d0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).message,(string *)&local_b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
  if (local_88._M_parent != (_Base_ptr)0x0) {
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_88._M_color;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_88._M_parent;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = local_88._M_left;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = local_88._M_right;
    (local_88._M_parent)->_M_parent = (_Base_ptr)local_150._M_p;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_68;
    local_88._M_parent = (_Base_ptr)0x0;
    local_68 = 0;
    local_88._M_left = &local_88;
    local_88._M_right = &local_88;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
  if (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &_Stack_60._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right;
    (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = local_148;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         _Stack_60._M_impl.super__Rb_tree_header._M_node_count;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&_Stack_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_a0 + 0x10));
  if (local_b0 != (_Base_ptr)local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0[0] != (_Base_ptr)local_c0) {
    operator_delete(local_d0[0]);
  }
  if (local_100[0] != (_Base_ptr)local_f0) {
    operator_delete(local_100[0]);
  }
  if ((char *)local_120._M_allocated_capacity != local_110) {
    operator_delete((void *)local_120._M_allocated_capacity);
  }
  if ((undefined1 *)local_140._M_allocated_capacity != local_130) {
    operator_delete((void *)local_140._M_allocated_capacity);
  }
  if ((code *)local_168._0_8_ != (code *)0x0) {
    (*(code *)local_168._0_8_)(local_178,local_178,3);
  }
  return __return_storage_ptr__;
}

Assistant:

PrivkeyHexDataStruct KeyStructApi::GetPrivkeyFromWif(
    const PrivkeyWifDataStruct& request) {
  auto call_func =
      [](const PrivkeyWifDataStruct& request) -> PrivkeyHexDataStruct {
    PrivkeyHexDataStruct response;

    NetType net_type = NetType::kMainnet;
    KeyApi api;
    Privkey privkey =
        api.GetPrivkeyFromWif(request.wif, &net_type, &response.is_compressed);
    response.hex = privkey.GetHex();
    response.network = AddressStructApi::ConvertNetTypeString(net_type);
    return response;
  };

  PrivkeyHexDataStruct result;
  result = ExecuteStructApi<PrivkeyWifDataStruct, PrivkeyHexDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}